

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_data.cpp
# Opt level: O3

Error * ot::commissioner::Ipv6PrefixFromString
                  (Error *__return_storage_ptr__,ByteArray *aPrefix,string *aStr)

{
  ErrorCode EVar1;
  ByteArray *this;
  long lVar2;
  ulonglong uVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Address addr;
  char *endPtr;
  string local_e0;
  undefined1 local_c0 [8];
  undefined1 *local_b8;
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  Address local_98;
  undefined1 local_78 [8];
  char *pcStack_70;
  size_t local_68;
  char local_60 [8];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  code *local_50;
  ByteArray *local_40;
  char *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_98.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = std::__cxx11::string::find((char)aStr,0x2f);
  if (lVar2 == -1) {
    local_78._0_4_ = string_type;
    pcStack_70 = "{} is not a valid IPv6 prefix";
    local_68 = 0x1d;
    local_60 = (char  [8])0x100000000;
    local_50 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar5 = "{} is not a valid IPv6 prefix";
    local_58 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78;
    do {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_78);
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != "");
    local_78 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
    pcStack_70 = (char *)aStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1d;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_(&local_e0,(v10 *)"{} is not a valid IPv6 prefix",fmt,args);
    local_c0._0_4_ = kInvalidArgs;
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
  }
  else {
    local_38 = (pointer)0x0;
    local_40 = aPrefix;
    uVar3 = strtoull((aStr->_M_dataplus)._M_p + lVar2 + 1,&local_38,0);
    if ((local_38 == (pointer)0x0) || (local_38 <= (aStr->_M_dataplus)._M_p + lVar2 + 1)) {
      local_78._0_4_ = string_type;
      pcStack_70 = "{} is not a valid IPv6 prefix";
      local_68 = 0x1d;
      local_60 = (char  [8])0x100000000;
      local_50 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar5 = "{} is not a valid IPv6 prefix";
      local_58 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78;
      do {
        pcVar4 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_78);
        }
        pcVar5 = pcVar4;
      } while (pcVar4 != "");
      local_78 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
      pcStack_70 = (char *)aStr->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1d;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_78;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"{} is not a valid IPv6 prefix",fmt_00,args_00);
      local_c0._0_4_ = kInvalidArgs;
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
    }
    else if (uVar3 < 0x81) {
      std::__cxx11::string::substr((ulong)local_c0,(ulong)aStr);
      Address::Set((Error *)local_78,&local_98,(string *)local_c0);
      __return_storage_ptr__->mCode = local_78._0_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->mMessage,(string *)&pcStack_70);
      EVar1 = __return_storage_ptr__->mCode;
      if (pcStack_70 != local_60) {
        operator_delete(pcStack_70);
      }
      this = local_40;
      if ((undefined1 *)CONCAT44(local_c0._4_4_,local_c0._0_4_) != local_b0) {
        operator_delete((undefined1 *)CONCAT44(local_c0._4_4_,local_c0._0_4_));
      }
      if (EVar1 != kNone) goto LAB_00188e3f;
      if ((long)local_98.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x10) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this,&local_98.mBytes)
        ;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,uVar3 >> 3);
        goto LAB_00188e3f;
      }
      local_78._0_4_ = string_type;
      pcStack_70 = "{} is not a valid IPv6 prefix";
      local_68 = 0x1d;
      local_60 = (char  [8])0x100000000;
      local_50 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar5 = "{} is not a valid IPv6 prefix";
      local_58 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78;
      do {
        pcVar4 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_78);
        }
        pcVar5 = pcVar4;
      } while (pcVar4 != "");
      local_78 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
      pcStack_70 = (char *)aStr->_M_string_length;
      fmt_02.size_ = 0xd;
      fmt_02.data_ = (char *)0x1d;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)local_78;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"{} is not a valid IPv6 prefix",fmt_02,args_02);
      local_c0._0_4_ = kInvalidArgs;
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
    }
    else {
      local_78._0_4_ = string_type;
      pcStack_70 = "{} is not a valid IPv6 prefix";
      local_68 = 0x1d;
      local_60 = (char  [8])0x100000000;
      local_50 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar5 = "{} is not a valid IPv6 prefix";
      local_58 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78;
      do {
        pcVar4 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_78);
        }
        pcVar5 = pcVar4;
      } while (pcVar4 != "");
      local_78 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
      pcStack_70 = (char *)aStr->_M_string_length;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x1d;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_78;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"{} is not a valid IPv6 prefix",fmt_01,args_01);
      local_c0._0_4_ = kInvalidArgs;
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
    }
  }
  __return_storage_ptr__->mCode = local_c0._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_b8);
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
LAB_00188e3f:
  if (local_98.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Ipv6PrefixFromString(ByteArray &aPrefix, const std::string &aStr)
{
    Error   error;
    size_t  slash;
    size_t  prefixLength;
    Address addr;

    slash = aStr.find('/');
    VerifyOrExit(slash != std::string::npos, error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));

    {
        char *endPtr = nullptr;
        prefixLength = strtoull(&aStr[slash + 1], &endPtr, 0);
        VerifyOrExit(endPtr != nullptr && endPtr > &aStr[slash + 1],
                     error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));
        VerifyOrExit(prefixLength <= 128, error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));
        prefixLength /= 8;
    }

    SuccessOrExit(error = addr.Set(aStr.substr(0, slash)));
    VerifyOrExit(addr.IsIpv6(), error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));

    aPrefix = addr.GetRaw();
    aPrefix.resize(prefixLength);

exit:
    return error;
}